

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errorHandle.cpp
# Opt level: O2

void __thiscall blc::error::exception::exception(exception *this,string *msg)

{
  ostream *poVar1;
  ostringstream oss;
  string local_1c0 [32];
  allocator<char> local_1a0 [376];
  
  *(undefined ***)this = &PTR__exception_0011aa20;
  std::__cxx11::string::string((string *)&this->_msg,(string *)msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_file,"ND",local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_func,"ND",local_1a0);
  this->_line = -1;
  this->_time = -1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"Error : ");
  std::operator<<(poVar1,(string *)msg);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_msg,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

blc::error::exception::exception(std::string msg) : _msg(msg), _file("ND"), _func("ND"), _line(-1), _time(-1) {
	std::ostringstream oss;

	oss << "Error : " << msg;
	this->_msg = oss.str();
}